

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_predict_intra_block_facade
               (AV1_COMMON *cm,MACROBLOCKD *xd,int plane,int blk_col,int blk_row,TX_SIZE tx_size)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  int width;
  long lVar4;
  uint8_t *puVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  TX_SIZE in_stack_0000001f;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  BLOCK_SIZE in_stack_0000002f;
  MACROBLOCKD *in_stack_00000030;
  PREDICTION_MODE in_stack_00000070;
  int in_stack_00000078;
  int in_stack_00000080;
  CFL_PRED_TYPE pred_plane;
  CFL_CTX *cfl;
  SequenceHeader *seq_params;
  int angle_delta;
  FILTER_INTRA_MODE filter_intra_mode;
  int use_palette;
  PREDICTION_MODE mode;
  uint8_t *dst;
  int in_stack_000000b0;
  int dst_stride;
  macroblockd_plane *pd;
  MB_MODE_INFO *mbmi;
  undefined4 in_stack_fffffffffffffef0;
  undefined2 uVar6;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  int plane_00;
  undefined4 in_stack_ffffffffffffff10;
  int iVar7;
  TX_SIZE tx_size_00;
  int in_stack_ffffffffffffff14;
  uint8_t *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 local_9c;
  
  tx_size_00 = (TX_SIZE)((uint)in_stack_ffffffffffffff10 >> 0x18);
  plane_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  uVar6 = (undefined2)((uint)in_stack_fffffffffffffef0 >> 0x10);
  lVar1 = **(long **)(in_RSI + 0x1eb8);
  lVar4 = in_RSI + 0x10 + (long)in_EDX * 0xa30;
  iVar7 = *(int *)(lVar4 + 0x28);
  puVar5 = (uint8_t *)(*(long *)(lVar4 + 0x10) + (long)((in_R8D * iVar7 + in_ECX) * 4));
  if (in_EDX != 0) {
    get_uv_mode(*(UV_PREDICTION_MODE *)(lVar1 + 3));
  }
  uVar3 = (uint)(*(char *)(lVar1 + 0x8e + (long)(int)(uint)(in_EDX != 0)) != '\0');
  if ((in_EDX == 0) && (*(char *)(lVar1 + 0x5b) != '\0')) {
    local_9c = (uint)*(byte *)(lVar1 + 0x5a);
  }
  else {
    local_9c = 5;
  }
  width = *(char *)(lVar1 + 0x58 + (long)(int)(uint)(in_EDX != 0)) * 3;
  if ((in_EDX == 0) || (*(char *)(lVar1 + 3) != '\r')) {
    av1_predict_intra_block
              (in_stack_00000030,in_stack_0000002f,in_stack_00000028,in_stack_00000024,
               in_stack_00000020,in_stack_0000001f,in_stack_00000070,in_stack_00000078,
               in_stack_00000080,(FILTER_INTRA_MODE)cfl,(uint8_t *)seq_params,angle_delta,
               _use_palette,(int)dst,in_stack_000000b0,(int)pd,(int)mbmi);
  }
  else {
    bVar2 = get_cfl_pred_type(in_EDX);
    if ((*(byte *)(in_RSI + 0x3a18 + (ulong)bVar2) & 1) == 0) {
      in_stack_ffffffffffffff18 = puVar5;
      in_stack_ffffffffffffff20 = iVar7;
      av1_predict_intra_block
                (in_stack_00000030,in_stack_0000002f,in_stack_00000028,in_stack_00000024,
                 in_stack_00000020,in_stack_0000001f,in_stack_00000070,in_stack_00000078,
                 in_stack_00000080,(FILTER_INTRA_MODE)cfl,(uint8_t *)seq_params,angle_delta,
                 _use_palette,(int)dst,in_stack_000000b0,(int)pd,(int)mbmi);
      tx_size_00 = (TX_SIZE)((uint)iVar7 >> 0x18);
      plane_00 = (int)((ulong)puVar5 >> 0x20);
      if ((*(byte *)(in_RSI + 0x3a1a) & 1) != 0) {
        cfl_store_dc_pred((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff04,local_9c),
                          (uint8_t *)CONCAT44(in_stack_fffffffffffffefc,uVar3),
                          (CFL_PRED_TYPE)((uint)in_stack_fffffffffffffef4 >> 0x18),width);
        *(undefined1 *)(in_RSI + 0x3a18 + (ulong)bVar2) = 1;
      }
    }
    else {
      cfl_load_dc_pred((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       in_stack_fffffffffffffef4,(TX_SIZE)((ushort)uVar6 >> 8),(CFL_PRED_TYPE)uVar6)
      ;
    }
    av1_cfl_predict_block
              ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,tx_size_00,plane_00);
  }
  return;
}

Assistant:

void av1_predict_intra_block_facade(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                    int plane, int blk_col, int blk_row,
                                    TX_SIZE tx_size) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  const int dst_stride = pd->dst.stride;
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  const PREDICTION_MODE mode =
      (plane == AOM_PLANE_Y) ? mbmi->mode : get_uv_mode(mbmi->uv_mode);
  const int use_palette = mbmi->palette_mode_info.palette_size[plane != 0] > 0;
  const FILTER_INTRA_MODE filter_intra_mode =
      (plane == AOM_PLANE_Y && mbmi->filter_intra_mode_info.use_filter_intra)
          ? mbmi->filter_intra_mode_info.filter_intra_mode
          : FILTER_INTRA_MODES;
  const int angle_delta = mbmi->angle_delta[plane != AOM_PLANE_Y] * ANGLE_STEP;
  const SequenceHeader *seq_params = cm->seq_params;

#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  if (plane != AOM_PLANE_Y && mbmi->uv_mode == UV_CFL_PRED) {
#if CONFIG_DEBUG
    assert(is_cfl_allowed(xd));
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);
    (void)plane_bsize;
    assert(plane_bsize < BLOCK_SIZES_ALL);
    if (!xd->lossless[mbmi->segment_id]) {
      assert(blk_col == 0);
      assert(blk_row == 0);
      assert(block_size_wide[plane_bsize] == tx_size_wide[tx_size]);
      assert(block_size_high[plane_bsize] == tx_size_high[tx_size]);
    }
#endif
    CFL_CTX *const cfl = &xd->cfl;
    CFL_PRED_TYPE pred_plane = get_cfl_pred_type(plane);
    if (!cfl->dc_pred_is_cached[pred_plane]) {
      av1_predict_intra_block(xd, seq_params->sb_size,
                              seq_params->enable_intra_edge_filter, pd->width,
                              pd->height, tx_size, mode, angle_delta,
                              use_palette, filter_intra_mode, dst, dst_stride,
                              dst, dst_stride, blk_col, blk_row, plane);
      if (cfl->use_dc_pred_cache) {
        cfl_store_dc_pred(xd, dst, pred_plane, tx_size_wide[tx_size]);
        cfl->dc_pred_is_cached[pred_plane] = true;
      }
    } else {
      cfl_load_dc_pred(xd, dst, dst_stride, tx_size, pred_plane);
    }
    av1_cfl_predict_block(xd, dst, dst_stride, tx_size, plane);
    return;
  }
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  av1_predict_intra_block(
      xd, seq_params->sb_size, seq_params->enable_intra_edge_filter, pd->width,
      pd->height, tx_size, mode, angle_delta, use_palette, filter_intra_mode,
      dst, dst_stride, dst, dst_stride, blk_col, blk_row, plane);
}